

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

fy_document *
fy_document_build_internal
          (fy_parse_cfg *cfg,_func_int_fy_parser_ptr_void_ptr *parser_setup,void *user)

{
  bool bVar1;
  int iVar2;
  fy_eventp *pfVar3;
  bool bVar4;
  int rc;
  _Bool got_stream_end;
  fy_eventp *fyep;
  fy_document *fyd;
  fy_parser *fyp;
  fy_parser fyp_data;
  void *user_local;
  _func_int_fy_parser_ptr_void_ptr *parser_setup_local;
  fy_parse_cfg *cfg_local;
  
  fyep = (fy_eventp *)0x0;
  if (parser_setup == (_func_int_fy_parser_ptr_void_ptr *)0x0) {
    return (fy_document *)0x0;
  }
  parser_setup_local = (_func_int_fy_parser_ptr_void_ptr *)cfg;
  if (cfg == (fy_parse_cfg *)0x0) {
    parser_setup_local = (_func_int_fy_parser_ptr_void_ptr *)&doc_parse_default_cfg;
  }
  fyp_data._448_8_ = user;
  iVar2 = fy_parse_setup((fy_parser *)&fyp,(fy_parse_cfg *)parser_setup_local);
  if (iVar2 != 0) {
    return (fy_document *)0x0;
  }
  iVar2 = (*parser_setup)((fy_parser *)&fyp,(void *)fyp_data._448_8_);
  if (iVar2 == 0) {
    fyep = (fy_eventp *)fy_parse_load_document((fy_parser *)&fyp);
    if (((fy_document *)fyep != (fy_document *)0x0) ||
       (fyp_data.tabsize._0_2_ = (ushort)fyp_data.tabsize & 0xffef,
       ((uint)fyp_data.cfg.search_path & 2) != 0)) {
      if ((fy_document *)fyep == (fy_document *)0x0) {
        fy_parser_diag((fy_parser *)&fyp,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                       ,0xbe0,"fy_document_build_internal","fy_parse_load_document() failed");
        fyp_data.tabsize._0_2_ = (ushort)fyp_data.tabsize & 0xffef;
        fyep = (fy_eventp *)fy_parse_document_create((fy_parser *)&fyp,(fy_eventp *)0x0);
        if ((fy_document *)fyep == (fy_document *)0x0) {
          fy_parser_diag((fy_parser *)&fyp,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                         ,0xbe5,"fy_document_build_internal","fy_parse_document_create() failed");
          fyep = (fy_eventp *)0x0;
          goto LAB_0012b59d;
        }
        ((fy_document *)fyep)->field_0x68 = ((fy_document *)fyep)->field_0x68 & 0xfe | 1;
      }
      else {
        bVar1 = false;
        while( true ) {
          bVar4 = false;
          if (!bVar1) {
            _rc = fy_parse_private((fy_parser *)&fyp);
            bVar4 = _rc != (fy_eventp *)0x0;
          }
          if (!bVar4) break;
          if ((_rc->e).type == FYET_STREAM_END) {
            bVar1 = true;
          }
          fy_parse_eventp_recycle((fy_parser *)&fyp,_rc);
        }
        if (bVar1) {
          pfVar3 = fy_parse_private((fy_parser *)&fyp);
          if (pfVar3 != (fy_eventp *)0x0) {
            fy_parser_diag((fy_parser *)&fyp,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                           ,0xbf6,"fy_document_build_internal","more events after stream end");
            goto LAB_0012b59d;
          }
          fy_parse_eventp_recycle((fy_parser *)&fyp,(fy_eventp *)0x0);
        }
      }
      fy_parse_cleanup((fy_parser *)&fyp);
      return (fy_document *)fyep;
    }
    fy_parser_diag((fy_parser *)&fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                   ,0xbdb,"fy_document_build_internal","fy_parse_load_document() failed");
  }
  else {
    fy_parser_diag((fy_parser *)&fyp,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                   ,0xbd1,"fy_document_build_internal","parser_setup() failed");
  }
LAB_0012b59d:
  fy_document_destroy((fy_document *)fyep);
  fy_parse_cleanup((fy_parser *)&fyp);
  return (fy_document *)0x0;
}

Assistant:

static struct fy_document *fy_document_build_internal(const struct fy_parse_cfg *cfg,
                                                      int (*parser_setup)(struct fy_parser *fyp, void *user),
                                                      void *user) {
    struct fy_parser fyp_data, *fyp = &fyp_data;
    struct fy_document *fyd = NULL;
    struct fy_eventp *fyep;
    bool got_stream_end;
    int rc;

    if (!parser_setup)
        return NULL;

    if (!cfg)
        cfg = &doc_parse_default_cfg;

    rc = fy_parse_setup(fyp, cfg);
    if (rc)
        return NULL;

    rc = (*parser_setup)(fyp, user);
    fyp_error_check(fyp, !rc, err_out,
                    "parser_setup() failed");

    fyd = fy_parse_load_document(fyp);

    /* we're going to handle stream errors from now */
    if (!fyd)
        fyp->stream_error = false;

    /* if we collect diagnostics, we can continue */
    fyp_error_check(fyp, fyd || (fyp->cfg.flags & FYPCF_COLLECT_DIAG), err_out,
                    "fy_parse_load_document() failed");

    /* no document, but we're collecting diagnostics */
    if (!fyd) {

        fyp_error(fyp, "fy_parse_load_document() failed");

        fyp->stream_error = false;
        fyd = fy_parse_document_create(fyp, NULL);
        fyp_error_check(fyp, fyd, err_out,
                        "fy_parse_document_create() failed");
        fyd->parse_error = true;

        /* XXX */
        goto out;
    }

    got_stream_end = false;
    while (!got_stream_end && (fyep = fy_parse_private(fyp)) != NULL) {
        if (fyep->e.type == FYET_STREAM_END)
            got_stream_end = true;
        fy_parse_eventp_recycle(fyp, fyep);
    }

    if (got_stream_end) {
        fyep = fy_parse_private(fyp);
        fyp_error_check(fyp, !fyep, err_out,
                        "more events after stream end");
        fy_parse_eventp_recycle(fyp, fyep);
    }

    out:
    fy_parse_cleanup(fyp);
    return fyd;

    err_out:
    fy_document_destroy(fyd);
    fy_parse_cleanup(fyp);
    return NULL;
}